

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  long local_78;
  pointer_____offset_0x60___ *local_70;
  undefined **local_68;
  undefined **local_60;
  TPZGeoEl *local_58;
  int local_50;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01893870;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_0188f190,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap
                    );
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_0188ee90;
  local_70 = &PTR_PTR_0188f190;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_0187bb90;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZGeoElSide::TPZGeoElSide(&local_48,cp->fNeighbours,(cp->super_TPZGeoEl).fMesh);
  local_78 = (local_48.fGeoEl)->fIndex;
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  local_68 = &PTR__TPZGeoElSide_018f8760;
  do {
    iVar2 = local_48.fSide;
    p_Var5 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var5 == (_Base_ptr)0x0) {
LAB_00e7c472:
      (**(code **)(*(long *)local_48.fGeoEl + 0x188))(&local_60,local_48.fGeoEl,local_48.fSide);
    }
    else {
      do {
        if (local_78 <= (long)*(size_t *)(p_Var5 + 1)) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(long)*(size_t *)(p_Var5 + 1) < local_78];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         ((long)((_Rb_tree_header *)p_Var4)->_M_node_count <= local_78)) {
        pmVar3 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](gl2lcElMap,&local_78);
        this->fNeighbours[0].fGeoElIndex = *pmVar3;
        this->fNeighbours[0].fSide = iVar2;
        return;
      }
      if (local_48.fGeoEl != (TPZGeoEl *)0x0) goto LAB_00e7c472;
      local_60 = local_68;
      local_58 = (TPZGeoEl *)0x0;
      local_50 = -1;
    }
    local_48.fSide = local_50;
    local_48.fGeoEl = local_58;
    local_78 = local_58->fIndex;
  } while( true );
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}